

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::FileGenerator
          (FileGenerator *this,FileDescriptor *file,Options *options)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  pointer puVar3;
  pointer ppDVar4;
  bool bVar5;
  mapped_type *pmVar6;
  MessageGenerator *pMVar7;
  Options *pOVar8;
  int i_4;
  int index;
  ulong uVar9;
  long lVar10;
  int i;
  long lVar11;
  allocator local_d2;
  allocator local_d1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_d0;
  FileGenerator *local_c8;
  MessageGenerator *msg_gen;
  Options *local_a0;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  msgs;
  key_type local_78;
  vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>>>
  *local_58;
  MessageSCCAnalyzer *local_50;
  vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>>>
  *local_48;
  vector<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>>>>
  *local_40;
  vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>>>>
  *local_38;
  
  p_Var1 = &(this->weak_deps_)._M_t._M_impl.super__Rb_tree_header;
  (this->weak_deps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->weak_deps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->weak_deps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->weak_deps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->weak_deps_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->file_ = file;
  local_a0 = &this->options_;
  local_c8 = this;
  Options::Options(local_a0,options);
  local_50 = &this->scc_analyzer_;
  MessageSCCAnalyzer::MessageSCCAnalyzer(local_50,options);
  local_d0 = &this->variables_;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_38 = (vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>>>>
              *)&this->message_generators_;
  local_48 = (vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>>>
              *)&this->enum_generators_;
  local_40 = (vector<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>>>>
              *)&this->service_generators_;
  local_58 = (vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>>>
              *)&this->extension_generators_;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->message_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->message_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->message_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->service_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->service_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->service_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SetCommonVars(options,local_d0);
  std::__cxx11::string::string((string *)&msgs,"dllexport_decl",(allocator *)&msg_gen);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_d0,(key_type *)&msgs);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  std::__cxx11::string::~string((string *)&msgs);
  std::__cxx11::string::string((string *)&msg_gen,"TableStruct",&local_d1);
  UniqueName((string *)&msgs,(string *)&msg_gen,local_c8->file_,local_a0);
  std::__cxx11::string::string((string *)&local_78,"tablename",&local_d2);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_d0,&local_78);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&msgs);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&msgs);
  std::__cxx11::string::~string((string *)&msg_gen);
  std::__cxx11::string::string((string *)&msg_gen,"file_level_metadata",&local_d1);
  pOVar8 = local_a0;
  UniqueName((string *)&msgs,(string *)&msg_gen,local_c8->file_,local_a0);
  std::__cxx11::string::string((string *)&local_78,"file_level_metadata",&local_d2);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_d0,&local_78);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&msgs);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&msgs);
  std::__cxx11::string::~string((string *)&msg_gen);
  DescriptorTableName_abi_cxx11_
            ((string *)&msgs,(cpp *)local_c8->file_,(FileDescriptor *)local_a0,pOVar8);
  std::__cxx11::string::string((string *)&msg_gen,"desc_table",(allocator *)&local_78);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_d0,(key_type *)&msg_gen);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&msgs);
  std::__cxx11::string::~string((string *)&msg_gen);
  std::__cxx11::string::~string((string *)&msgs);
  std::__cxx11::string::string((string *)&msg_gen,"file_level_enum_descriptors",&local_d1);
  UniqueName((string *)&msgs,(string *)&msg_gen,local_c8->file_,local_a0);
  std::__cxx11::string::string((string *)&local_78,"file_level_enum_descriptors",&local_d2);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_d0,&local_78);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&msgs);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&msgs);
  std::__cxx11::string::~string((string *)&msg_gen);
  std::__cxx11::string::string((string *)&msg_gen,"file_level_service_descriptors",&local_d1);
  pOVar8 = local_a0;
  UniqueName((string *)&msgs,(string *)&msg_gen,local_c8->file_,local_a0);
  std::__cxx11::string::string((string *)&local_78,"file_level_service_descriptors",&local_d2);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_d0,&local_78);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&msgs);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&msgs);
  std::__cxx11::string::~string((string *)&msg_gen);
  std::__cxx11::string::string((string *)&msgs,"filename",(allocator *)&msg_gen);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_d0,(key_type *)&msgs);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  std::__cxx11::string::~string((string *)&msgs);
  Namespace_abi_cxx11_((string *)&msgs,(cpp *)local_c8->file_,(FileDescriptor *)options,pOVar8);
  std::__cxx11::string::string((string *)&msg_gen,"package_ns",(allocator *)&local_78);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_d0,(key_type *)&msg_gen);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&msgs);
  std::__cxx11::string::~string((string *)&msg_gen);
  std::__cxx11::string::~string((string *)&msgs);
  FlattenMessagesInFile(&msgs,file);
  for (uVar9 = 0;
      ppDVar4 = msgs.
                super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar9 < (ulong)((long)msgs.
                            super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)msgs.
                            super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar9 = uVar9 + 1) {
    pMVar7 = (MessageGenerator *)operator_new(0x220);
    MessageGenerator::MessageGenerator(pMVar7,ppDVar4[uVar9],local_d0,(int)uVar9,options,local_50);
    msg_gen = pMVar7;
    std::
    vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>>>>
    ::emplace_back<google::protobuf::compiler::cpp::MessageGenerator*&>(local_38,&msg_gen);
    MessageGenerator::AddGenerators
              (msg_gen,(vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                        *)local_48,
               (vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                *)local_58);
  }
  lVar10 = 0;
  for (lVar11 = 0; lVar11 < *(int *)(file + 0x30); lVar11 = lVar11 + 1) {
    pMVar7 = (MessageGenerator *)operator_new(0x68);
    EnumGenerator::EnumGenerator
              ((EnumGenerator *)pMVar7,(EnumDescriptor *)(*(long *)(file + 0x60) + lVar10),local_d0,
               options);
    msg_gen = pMVar7;
    std::
    vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>>>
    ::emplace_back<google::protobuf::compiler::cpp::EnumGenerator*>
              (local_48,(EnumGenerator **)&msg_gen);
    lVar10 = lVar10 + 0x48;
  }
  lVar10 = 0;
  for (lVar11 = 0; lVar11 < *(int *)(file + 0x34); lVar11 = lVar11 + 1) {
    pMVar7 = (MessageGenerator *)operator_new(0x48);
    ServiceGenerator::ServiceGenerator
              ((ServiceGenerator *)pMVar7,(ServiceDescriptor *)(*(long *)(file + 0x68) + lVar10),
               local_d0,options);
    msg_gen = pMVar7;
    std::
    vector<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>>>>
    ::emplace_back<google::protobuf::compiler::cpp::ServiceGenerator*>
              (local_40,(ServiceGenerator **)&msg_gen);
    lVar10 = lVar10 + 0x30;
  }
  bVar5 = HasGenericServices(local_c8->file_,local_a0);
  if (bVar5) {
    puVar2 = (local_c8->service_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (local_c8->service_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar10 = 0; (long)puVar3 - (long)puVar2 >> 3 != lVar10; lVar10 = lVar10 + 1) {
      *(int *)((long)puVar2[lVar10]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>
                     ._M_t + 0x40) = (int)lVar10;
    }
  }
  lVar10 = 0;
  for (lVar11 = 0; lVar11 < *(int *)(file + 0x3c); lVar11 = lVar11 + 1) {
    pMVar7 = (MessageGenerator *)operator_new(0x150);
    ExtensionGenerator::ExtensionGenerator
              ((ExtensionGenerator *)pMVar7,(FieldDescriptor *)(*(long *)(file + 0x70) + lVar10),
               options,local_50);
    msg_gen = pMVar7;
    std::
    vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>>>
    ::emplace_back<google::protobuf::compiler::cpp::ExtensionGenerator*>
              (local_58,(ExtensionGenerator **)&msg_gen);
    lVar10 = lVar10 + 0x48;
  }
  for (index = 0; index < *(int *)(file + 0x28); index = index + 1) {
    msg_gen = (MessageGenerator *)FileDescriptor::weak_dependency(file,index);
    std::
    _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
    ::_M_insert_unique<google::protobuf::FileDescriptor_const*>
              ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                *)local_c8,(FileDescriptor **)&msg_gen);
  }
  std::
  _Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~_Vector_base(&msgs.
                   super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 );
  return;
}

Assistant:

FileGenerator::FileGenerator(const FileDescriptor* file, const Options& options)
    : file_(file), options_(options), scc_analyzer_(options) {
  // These variables are the same on a file level
  SetCommonVars(options, &variables_);
  variables_["dllexport_decl"] = options.dllexport_decl;
  variables_["tablename"] = UniqueName("TableStruct", file_, options_);
  variables_["file_level_metadata"] =
      UniqueName("file_level_metadata", file_, options_);
  variables_["desc_table"] = DescriptorTableName(file_, options_);
  variables_["file_level_enum_descriptors"] =
      UniqueName("file_level_enum_descriptors", file_, options_);
  variables_["file_level_service_descriptors"] =
      UniqueName("file_level_service_descriptors", file_, options_);
  variables_["filename"] = file_->name();
  variables_["package_ns"] = Namespace(file_, options);

  std::vector<const Descriptor*> msgs = FlattenMessagesInFile(file);
  for (int i = 0; i < msgs.size(); i++) {
    // Deleted in destructor
    MessageGenerator* msg_gen =
        new MessageGenerator(msgs[i], variables_, i, options, &scc_analyzer_);
    message_generators_.emplace_back(msg_gen);
    msg_gen->AddGenerators(&enum_generators_, &extension_generators_);
  }

  for (int i = 0; i < file->enum_type_count(); i++) {
    enum_generators_.emplace_back(
        new EnumGenerator(file->enum_type(i), variables_, options));
  }

  for (int i = 0; i < file->service_count(); i++) {
    service_generators_.emplace_back(
        new ServiceGenerator(file->service(i), variables_, options));
  }
  if (HasGenericServices(file_, options_)) {
    for (int i = 0; i < service_generators_.size(); i++) {
      service_generators_[i]->index_in_metadata_ = i;
    }
  }
  for (int i = 0; i < file->extension_count(); i++) {
    extension_generators_.emplace_back(
        new ExtensionGenerator(file->extension(i), options, &scc_analyzer_));
  }
  for (int i = 0; i < file->weak_dependency_count(); ++i) {
    weak_deps_.insert(file->weak_dependency(i));
  }
}